

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthash.cpp
# Opt level: O0

uint64_t fasthash64(void *buf,size_t len,uint64_t seed)

{
  uint64_t uVar1;
  ulong in_RDX;
  ulong in_RSI;
  uint64_t *in_RDI;
  uint64_t v;
  uint64_t h;
  uchar *pos2;
  uint64_t *end;
  uint64_t *pos;
  uint64_t m;
  ulong local_48;
  ulong local_40;
  uint64_t *local_28;
  
  local_40 = in_RDX ^ in_RSI * -0x77fcaa0de192e69b;
  local_28 = in_RDI;
  while (local_28 != (uint64_t *)((long)in_RDI + (in_RSI & 0xfffffffffffffff8))) {
    uVar1 = mix(*local_28);
    local_40 = (uVar1 ^ local_40) * -0x77fcaa0de192e69b;
    local_28 = local_28 + 1;
  }
  local_48 = 0;
  switch((uint)in_RSI & 7) {
  case 7:
    local_48 = (ulong)*(byte *)((long)local_28 + 6) << 0x30;
  case 6:
    local_48 = (ulong)*(byte *)((long)local_28 + 5) << 0x28 ^ local_48;
  case 5:
    local_48 = (ulong)*(byte *)((long)local_28 + 4) << 0x20 ^ local_48;
  case 4:
    local_48 = (ulong)*(byte *)((long)local_28 + 3) << 0x18 ^ local_48;
  case 3:
    local_48 = (ulong)*(byte *)((long)local_28 + 2) << 0x10 ^ local_48;
  case 2:
    local_48 = (ulong)*(byte *)((long)local_28 + 1) << 8 ^ local_48;
  case 1:
    uVar1 = mix((byte)*local_28 ^ local_48);
    local_40 = (uVar1 ^ local_40) * -0x77fcaa0de192e69b;
  default:
    uVar1 = mix(local_40);
    return uVar1;
  }
}

Assistant:

uint64_t fasthash64(const void *buf, size_t len, uint64_t seed)
{
	const uint64_t    m = 0x880355f21e6d1965ULL;
	const uint64_t *pos = (const uint64_t *)buf;
	const uint64_t *end = pos + (len / 8);
	const unsigned char *pos2;
	uint64_t h = seed ^ (len * m);
	uint64_t v;

	while (pos != end) {
		v  = *pos++;
		h ^= mix(v);
		h *= m;
	}

	pos2 = (const unsigned char*)pos;
	v = 0;

	switch (len & 7) {
	case 7: v ^= (uint64_t)pos2[6] << 48;
	case 6: v ^= (uint64_t)pos2[5] << 40;
	case 5: v ^= (uint64_t)pos2[4] << 32;
	case 4: v ^= (uint64_t)pos2[3] << 24;
	case 3: v ^= (uint64_t)pos2[2] << 16;
	case 2: v ^= (uint64_t)pos2[1] << 8;
	case 1: v ^= (uint64_t)pos2[0];
		h ^= mix(v);
		h *= m;
	}

	return mix(h);
}